

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_ZMovement(AActor *mo,double oldfloorz)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  AActor *pAVar5;
  Self *other;
  TArray<F3DFloor_*,_F3DFloor_*> *this;
  F3DFloor **ppFVar6;
  ASectorAction *pAVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double local_158;
  double local_150;
  double local_130;
  TFlags<ActorFlag3,_unsigned_int> local_114;
  TFlags<ActorFlag3,_unsigned_int> local_110;
  TFlags<ActorFlag,_unsigned_int> local_10c;
  TFlags<ActorFlag,_unsigned_int> local_108;
  TFlags<ActorFlag,_unsigned_int> local_104;
  TFlags<ActorBounceFlag,_unsigned_short> local_fe;
  TFlags<ActorFlag2,_unsigned_int> local_fc;
  TFlags<ActorFlag,_unsigned_int> local_f8;
  TFlags<ActorFlag,_unsigned_int> local_f4;
  TAngle<double> local_f0;
  FName local_e8;
  TFlags<ActorFlag7,_unsigned_int> local_e4;
  undefined8 local_e0;
  double minvel;
  TFlags<ActorFlag3,_unsigned_int> local_d0;
  TFlags<ActorFlag3,_unsigned_int> local_cc;
  TFlags<ActorFlag3,_unsigned_int> local_c8;
  TFlags<ActorBounceFlag,_unsigned_short> local_c2;
  TFlags<ActorFlag,_unsigned_int> local_c0;
  TFlags<ActorFlag,_unsigned_int> local_bc;
  F3DFloor *local_b8;
  F3DFloor *rover;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  double friction;
  TAngle<double> local_88;
  TFlags<ActorFlag,_unsigned_int> local_80;
  undefined1 local_7c [4];
  TFlags<ActorFlag,_unsigned_int> local_78;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  TFlags<ActorFlag,_unsigned_int> local_70;
  TFlags<ActorFlag2,_unsigned_int> local_6c;
  undefined8 local_68;
  double sinkspeed_1;
  TFlags<ActorFlag3,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  double local_50;
  double sinkspeed;
  double startvelz;
  double local_38;
  double grav;
  double oldz;
  double delta;
  double dist;
  double oldfloorz_local;
  AActor *mo_local;
  
  dist = oldfloorz;
  oldfloorz_local = (double)mo;
  grav = AActor::Z(mo);
  local_38 = AActor::GetGravity((AActor *)oldfloorz_local);
  if (((*(long *)((long)oldfloorz_local + 0x230) != 0) &&
      (**(double **)((long)oldfloorz_local + 0x230) == oldfloorz_local)) &&
     (dVar9 = AActor::Z((AActor *)oldfloorz_local),
     dVar9 < *(double *)((long)oldfloorz_local + 0x140))) {
    dVar9 = *(double *)((long)oldfloorz_local + 0x140);
    dVar10 = AActor::Z((AActor *)oldfloorz_local);
    *(double *)(*(long *)((long)oldfloorz_local + 0x230) + 0x68) =
         *(double *)(*(long *)((long)oldfloorz_local + 0x230) + 0x68) - (dVar9 - dVar10);
    dVar9 = player_t::GetDeltaViewHeight(*(player_t **)((long)oldfloorz_local + 0x230));
    *(double *)(*(long *)((long)oldfloorz_local + 0x230) + 0x70) = dVar9;
  }
  AActor::AddZ((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0xd8),true);
  dVar9 = AActor::Z((AActor *)oldfloorz_local);
  bVar8 = false;
  if (*(double *)((long)oldfloorz_local + 0x140) <= dVar9 &&
      dVar9 != *(double *)((long)oldfloorz_local + 0x140)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&startvelz + 4),
               SUB84(oldfloorz_local,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&startvelz + 4));
    bVar8 = uVar3 == 0;
  }
  if (!bVar8) goto LAB_005aa6dd;
  sinkspeed = *(double *)((long)oldfloorz_local + 0xd8);
  if ((*(int *)((long)oldfloorz_local + 0x2d0) == 0) ||
     ((*(long *)((long)oldfloorz_local + 0x230) != 0 &&
      (*(short *)(*(long *)((long)oldfloorz_local + 0x230) + 0x16) == 0 &&
       *(short *)(*(long *)((long)oldfloorz_local + 0x230) + 0x18) == 0)))) {
    if ((*(double *)((long)oldfloorz_local + 0xd8) == 0.0) &&
       ((!NAN(*(double *)((long)oldfloorz_local + 0xd8)) &&
        (*(double *)((long)oldfloorz_local + 0x140) <= dist &&
         dist != *(double *)((long)oldfloorz_local + 0x140))))) {
      dVar9 = AActor::Z((AActor *)oldfloorz_local);
      if ((dVar9 == dist) && (!NAN(dVar9) && !NAN(dist))) {
        *(double *)((long)oldfloorz_local + 0xd8) =
             *(double *)((long)oldfloorz_local + 0xd8) - (local_38 + local_38);
        goto LAB_005aa376;
      }
    }
    *(double *)((long)oldfloorz_local + 0xd8) = *(double *)((long)oldfloorz_local + 0xd8) - local_38
    ;
  }
LAB_005aa376:
  if (*(long *)((long)oldfloorz_local + 0x230) == 0) {
    if (0 < *(int *)((long)oldfloorz_local + 0x2d0)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_54,
                 SUB84(oldfloorz_local,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
      bVar8 = false;
      if (uVar3 != 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_58,
                   SUB84(oldfloorz_local,0) +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
        bVar8 = uVar3 == 0;
      }
      if (bVar8) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&sinkspeed_1 + 4),
                   SUB84(oldfloorz_local,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&sinkspeed_1 + 4));
        local_130 = -0.0625;
        if (uVar3 == 0) {
          local_130 = 0.0;
        }
        local_50 = local_130;
      }
      else {
        local_50 = -0.5;
        if (*(long *)((long)oldfloorz_local + 0x230) == 0) {
          iVar4 = clamp<int>(*(int *)((long)oldfloorz_local + 0x3f8),1,4000);
          local_50 = ((double)iVar4 * -0.5) / 100.0;
        }
      }
      dVar9 = sinkspeed;
      if (local_50 <= *(double *)((long)oldfloorz_local + 0xd8)) {
        if (local_50 < *(double *)((long)oldfloorz_local + 0xd8)) {
          dVar10 = MAX<double>(local_50 / 3.0,-8.0);
          *(double *)((long)oldfloorz_local + 0xd8) = dVar9 + dVar10;
          if (*(double *)((long)oldfloorz_local + 0xd8) < local_50) {
            *(double *)((long)oldfloorz_local + 0xd8) = local_50;
          }
        }
      }
      else {
        dVar9 = MAX<double>(local_50 * 2.0,-8.0);
        *(double *)((long)oldfloorz_local + 0xd8) =
             *(double *)((long)oldfloorz_local + 0xd8) - dVar9;
        if (local_50 < *(double *)((long)oldfloorz_local + 0xd8)) {
          *(double *)((long)oldfloorz_local + 0xd8) = local_50;
        }
      }
    }
  }
  else if (1 < *(int *)((long)oldfloorz_local + 0x2d0)) {
    local_68 = 0xbfe0000000000000;
    if (-0.5 <= *(double *)((long)oldfloorz_local + 0xd8)) {
      local_158 = 0.25;
      if (*(int *)((long)oldfloorz_local + 0x2d0) != 1) {
        local_158 = 0.125;
      }
      *(double *)((long)oldfloorz_local + 0xd8) =
           sinkspeed + (*(double *)((long)oldfloorz_local + 0xd8) - sinkspeed) * local_158;
    }
    else {
      if (-0.5 <= sinkspeed) {
        local_150 = -0.5;
      }
      else {
        local_150 = sinkspeed;
      }
      *(double *)((long)oldfloorz_local + 0xd8) = local_150;
    }
  }
LAB_005aa6dd:
  bVar8 = false;
  if (0.0 < *(double *)((long)oldfloorz_local + 0x1e8)) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_6c,SUB84(oldfloorz_local,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
    bVar8 = false;
    if (uVar3 != 0) {
      bVar8 = (ib_compatflags & 0x100U) != 0;
    }
  }
  if (bVar8) {
    AActor::SetZ((AActor *)oldfloorz_local,
                 *(double *)((long)oldfloorz_local + 0x140) +
                 *(double *)((long)oldfloorz_local + 0x1e8),true);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_70,
             SUB84(oldfloorz_local,0) +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
  bVar8 = false;
  if (uVar3 != 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_74,SUB84(oldfloorz_local,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    bVar8 = false;
    if (uVar3 == 0) {
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)oldfloorz_local + 0x208));
      bVar8 = pAVar5 != (AActor *)0x0;
    }
  }
  if (bVar8) {
    other = (Self *)((long)oldfloorz_local + 0x1bc);
    operator|((EnumType)local_7c,MF_SKULLFLY);
    TFlags<ActorFlag,_unsigned_int>::operator&(&local_78,other);
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_78);
    dVar9 = oldfloorz_local;
    if (uVar3 == 0) {
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)oldfloorz_local + 0x208));
      delta = AActor::Distance2D((AActor *)dVar9,pAVar5,false);
      pAVar5 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)((long)oldfloorz_local + 0x208));
      dVar9 = AActor::Center(pAVar5);
      dVar10 = AActor::Z((AActor *)oldfloorz_local);
      oldz = dVar9 - dVar10;
      if ((0.0 <= oldz) || (-(oldz * 3.0) <= delta)) {
        if ((0.0 < oldz) && (delta < oldz * 3.0)) {
          AActor::AddZ((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0xe8),true);
        }
      }
      else {
        AActor::AddZ((AActor *)oldfloorz_local,-*(double *)((long)oldfloorz_local + 0xe8),true);
      }
    }
  }
  bVar8 = false;
  if (*(long *)((long)oldfloorz_local + 0x230) != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_80,
               SUB84(oldfloorz_local,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
    bVar8 = false;
    if (uVar3 != 0) {
      dVar9 = AActor::Z((AActor *)oldfloorz_local);
      bVar8 = *(double *)((long)oldfloorz_local + 0x140) <= dVar9 &&
              dVar9 != *(double *)((long)oldfloorz_local + 0x140);
    }
  }
  if (bVar8) {
    bVar8 = AActor::IsNoClip2((AActor *)oldfloorz_local);
    dVar9 = oldfloorz_local;
    if (!bVar8) {
      TAngle<double>::TAngle(&local_88,(double)((float)level.maptime * 4.5));
      dVar10 = TAngle<double>::Sin(&local_88);
      AActor::AddZ((AActor *)dVar9,dVar10 / 8.0,true);
    }
    *(double *)((long)oldfloorz_local + 0xd8) =
         *(double *)((long)oldfloorz_local + 0xd8) * 0.91796875;
  }
  bVar8 = false;
  if (*(int *)((long)oldfloorz_local + 0x2d0) != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&friction + 4),
               SUB84(oldfloorz_local,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&friction + 4));
    bVar8 = uVar3 == 0;
  }
  if (bVar8) {
    __range2 = (TDeletingArray<F3DFloor_*,_F3DFloor_*> *)0xbff0000000000000;
    this = (TArray<F3DFloor_*,_F3DFloor_*> *)
           (*(long *)(*(long *)((long)oldfloorz_local + 0x130) + 0x210) + 0x70);
    __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin(this);
    rover = (F3DFloor *)TArray<F3DFloor_*,_F3DFloor_*>::end(this);
    while (bVar8 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover), bVar8
          ) {
      ppFVar6 = TIterator<F3DFloor_*>::operator*(&__end2);
      local_b8 = *ppFVar6;
      if (((local_b8->flags & 1) != 0) && ((local_b8->flags & 0x10) != 0)) {
        dVar9 = AActor::Z((AActor *)oldfloorz_local);
        dVar10 = secplane_t::ZatPoint((local_b8->top).plane,(AActor *)oldfloorz_local);
        if (dVar9 < dVar10) {
          dVar9 = AActor::Center((AActor *)oldfloorz_local);
          dVar10 = secplane_t::ZatPoint((local_b8->bottom).plane,(AActor *)oldfloorz_local);
          if (dVar10 <= dVar9) {
            __range2 = (TDeletingArray<F3DFloor_*,_F3DFloor_*> *)
                       sector_t::GetFriction
                                 (local_b8->model,(local_b8->top).isceiling,(double *)0x0);
            break;
          }
        }
      }
      TIterator<F3DFloor_*>::operator++(&__end2);
    }
    if ((double)__range2 < 0.0) {
      __range2 = (TDeletingArray<F3DFloor_*,_F3DFloor_*> *)
                 sector_t::GetFriction
                           (*(sector_t **)((long)oldfloorz_local + 0x130),0,(double *)0x0);
    }
    *(double *)((long)oldfloorz_local + 0xd8) =
         (double)__range2 * *(double *)((long)oldfloorz_local + 0xd8);
  }
  dVar9 = AActor::Z((AActor *)oldfloorz_local);
  if (dVar9 <= *(double *)((long)oldfloorz_local + 0x140)) {
    if (((*(long *)((long)oldfloorz_local + 0x230) == 0) ||
        ((*(uint *)(*(long *)((long)oldfloorz_local + 0x230) + 0xe8) & 0x2000) == 0)) &&
       (bVar8 = TObjPtr<ASectorAction>::operator!=
                          ((TObjPtr<ASectorAction> *)
                           (*(long *)((long)oldfloorz_local + 0x130) + 0x1f8),(ASectorAction *)0x0),
       bVar8)) {
      dVar9 = secplane_t::ZatPoint
                        ((secplane_t *)(*(long *)((long)oldfloorz_local + 0x130) + 0xb0),
                         (AActor *)oldfloorz_local);
      if ((dVar9 == *(double *)((long)oldfloorz_local + 0x140)) &&
         (!NAN(dVar9) && !NAN(*(double *)((long)oldfloorz_local + 0x140)))) {
        pAVar7 = TObjPtr<ASectorAction>::operator->
                           ((TObjPtr<ASectorAction> *)
                            (*(long *)((long)oldfloorz_local + 0x130) + 0x1f8));
        ASectorAction::TriggerAction(pAVar7,(AActor *)oldfloorz_local,4);
      }
    }
    P_CheckFor3DFloorHit((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0x140));
    dVar9 = AActor::Z((AActor *)oldfloorz_local);
    if (dVar9 <= *(double *)((long)oldfloorz_local + 0x140)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_bc,
                 SUB84(oldfloorz_local,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
      bVar8 = false;
      if (uVar3 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_c0,
                   SUB84(oldfloorz_local,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c0);
        bVar8 = uVar3 == 0;
      }
      if (bVar8) {
        AActor::SetZ((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0x140),true);
        TFlags<ActorBounceFlag,_unsigned_short>::operator&
                  (&local_c2,
                   SUB84(oldfloorz_local,0) +
                   (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                   BOUNCE_Actors));
        uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_c2);
        if (uVar2 != 0) {
          AActor::FloorBounceMissile
                    ((AActor *)oldfloorz_local,
                     (secplane_t *)(*(long *)((long)oldfloorz_local + 0x158) + 0xb0));
          return;
        }
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_c8,
                   SUB84(oldfloorz_local,0) +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c8);
        if (uVar3 != 0) {
          P_HitFloor((AActor *)oldfloorz_local);
          *(undefined8 *)((long)oldfloorz_local + 0xd8) = 0;
          return;
        }
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_cc,
                   SUB84(oldfloorz_local,0) +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
        if (uVar3 != 0) {
          return;
        }
        bVar1 = FTextureID::operator==((FTextureID *)((long)oldfloorz_local + 0x160),&skyflatnum);
        bVar8 = false;
        if (bVar1) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_d0,
                     SUB84(oldfloorz_local,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_d0);
          bVar8 = uVar3 == 0;
        }
        if (!bVar8) {
          P_HitFloor((AActor *)oldfloorz_local);
          P_ExplodeMissile((AActor *)oldfloorz_local,(line_t_conflict *)0x0,(AActor *)0x0);
          return;
        }
        (**(code **)(*(long *)oldfloorz_local + 0x20))();
        return;
      }
      TFlags<ActorBounceFlag,_unsigned_short>::operator&
                ((TFlags<ActorBounceFlag,_unsigned_short> *)((long)&minvel + 6),
                 SUB84(oldfloorz_local,0) +
                 (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|BOUNCE_Actors)
                );
      uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)((long)&minvel + 6));
      bVar8 = false;
      if (uVar2 != 0) {
        bVar8 = *(double *)((long)oldfloorz_local + 0xd8) != 0.0;
      }
      if (bVar8) {
        AActor::FloorBounceMissile
                  ((AActor *)oldfloorz_local,
                   (secplane_t *)(*(long *)((long)oldfloorz_local + 0x158) + 0xb0));
      }
      TFlags<ActorFlag3,_unsigned_int>::operator&
                ((TFlags<ActorFlag3,_unsigned_int> *)&minvel,
                 SUB84(oldfloorz_local,0) +
                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&minvel);
      if ((uVar3 != 0) &&
         (*(double *)((long)oldfloorz_local + 0xd8) <= -23.0 &&
          *(double *)((long)oldfloorz_local + 0xd8) != -23.0)) {
        P_MonsterFallingDamage((AActor *)oldfloorz_local);
      }
      AActor::SetZ((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0x140),true);
      if (*(double *)((long)oldfloorz_local + 0xd8) <= 0.0 &&
          *(double *)((long)oldfloorz_local + 0xd8) != 0.0) {
        local_e0 = 0xc020000000000000;
        P_HitFloor((AActor *)oldfloorz_local);
        bVar8 = FName::operator==((FName *)((long)oldfloorz_local + 0x404),NAME_Ice);
        if ((bVar8) &&
           (*(double *)((long)oldfloorz_local + 0xd8) <= -8.0 &&
            *(double *)((long)oldfloorz_local + 0xd8) != -8.0)) {
          *(undefined4 *)((long)oldfloorz_local + 0x198) = 1;
          TVector3<double>::Zero((TVector3<double> *)((long)oldfloorz_local + 200));
          return;
        }
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  (&local_e4,
                   SUB84(oldfloorz_local,0) +
                   (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
        dVar9 = oldfloorz_local;
        if (uVar3 != 0) {
          iVar4 = *(int *)((long)oldfloorz_local + 0x1fc);
          FName::FName(&local_e8,NAME_Smash);
          TAngle<double>::TAngle(&local_f0,0.0);
          P_DamageMobj((AActor *)dVar9,(AActor *)0x0,(AActor *)0x0,iVar4,&local_e8,0,&local_f0);
        }
        if (*(long *)((long)oldfloorz_local + 0x230) != 0) {
          if ((*(int *)(*(long *)((long)oldfloorz_local + 0x230) + 0x16c) < 0) ||
             (*(double *)((long)oldfloorz_local + 0xd8) <= -8.0 &&
              *(double *)((long)oldfloorz_local + 0xd8) != -8.0)) {
            *(undefined4 *)(*(long *)((long)oldfloorz_local + 0x230) + 0x16c) = 7;
          }
          bVar8 = false;
          if (*(double *)((long)oldfloorz_local + 0xd8) <= -8.0 &&
              *(double *)((long)oldfloorz_local + 0xd8) != -8.0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_f4,
                       SUB84(oldfloorz_local,0) +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
            bVar8 = uVar3 == 0;
          }
          if (bVar8) {
            PlayerLandedOnThing((AActor *)oldfloorz_local,(AActor *)0x0);
          }
        }
        *(undefined8 *)((long)oldfloorz_local + 0xd8) = 0;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_f8,
                 SUB84(oldfloorz_local,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f8);
      if (uVar3 != 0) {
        *(ulong *)((long)oldfloorz_local + 0xd8) =
             *(ulong *)((long)oldfloorz_local + 0xd8) ^ 0x8000000000000000;
      }
      AActor::Crash((AActor *)oldfloorz_local);
    }
  }
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_fc,SUB84(oldfloorz_local,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
  if (uVar3 != 0) {
    AActor::AdjustFloorClip((AActor *)oldfloorz_local);
  }
  dVar9 = AActor::Top((AActor *)oldfloorz_local);
  if (*(double *)((long)oldfloorz_local + 0x148) <= dVar9 &&
      dVar9 != *(double *)((long)oldfloorz_local + 0x148)) {
    if (((*(long *)((long)oldfloorz_local + 0x230) == 0) ||
        ((*(uint *)(*(long *)((long)oldfloorz_local + 0x230) + 0xe8) & 0x2000) == 0)) &&
       (bVar8 = TObjPtr<ASectorAction>::operator!=
                          ((TObjPtr<ASectorAction> *)
                           (*(long *)((long)oldfloorz_local + 0x130) + 0x1f8),(ASectorAction *)0x0),
       bVar8)) {
      dVar9 = secplane_t::ZatPoint
                        ((secplane_t *)(*(long *)((long)oldfloorz_local + 0x130) + 0xd8),
                         (AActor *)oldfloorz_local);
      if ((dVar9 == *(double *)((long)oldfloorz_local + 0x148)) &&
         (!NAN(dVar9) && !NAN(*(double *)((long)oldfloorz_local + 0x148)))) {
        pAVar7 = TObjPtr<ASectorAction>::operator->
                           ((TObjPtr<ASectorAction> *)
                            (*(long *)((long)oldfloorz_local + 0x130) + 0x1f8));
        ASectorAction::TriggerAction(pAVar7,(AActor *)oldfloorz_local,8);
      }
    }
    P_CheckFor3DCeilingHit((AActor *)oldfloorz_local,*(double *)((long)oldfloorz_local + 0x148));
    dVar9 = AActor::Top((AActor *)oldfloorz_local);
    if (*(double *)((long)oldfloorz_local + 0x148) <= dVar9 &&
        dVar9 != *(double *)((long)oldfloorz_local + 0x148)) {
      AActor::SetZ((AActor *)oldfloorz_local,
                   *(double *)((long)oldfloorz_local + 0x148) -
                   *(double *)((long)oldfloorz_local + 0x180),true);
      TFlags<ActorBounceFlag,_unsigned_short>::operator&
                (&local_fe,
                 SUB84(oldfloorz_local,0) +
                 (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|BOUNCE_Actors)
                );
      uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_fe);
      if (uVar2 != 0) {
        AActor::FloorBounceMissile
                  ((AActor *)oldfloorz_local,
                   (secplane_t *)(*(long *)((long)oldfloorz_local + 0x168) + 0xd8));
        return;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_104,
                 SUB84(oldfloorz_local,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
      if (uVar3 != 0) {
        *(ulong *)((long)oldfloorz_local + 0xd8) =
             *(ulong *)((long)oldfloorz_local + 0xd8) ^ 0x8000000000000000;
      }
      if (0.0 < *(double *)((long)oldfloorz_local + 0xd8)) {
        *(undefined8 *)((long)oldfloorz_local + 0xd8) = 0;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_108,
                 SUB84(oldfloorz_local,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
      bVar8 = false;
      if (uVar3 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_10c,
                   SUB84(oldfloorz_local,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_10c);
        bVar8 = uVar3 == 0;
      }
      if (bVar8) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_110,
                   SUB84(oldfloorz_local,0) +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_110);
        if (uVar3 != 0) {
          return;
        }
        bVar1 = FTextureID::operator==((FTextureID *)((long)oldfloorz_local + 0x170),&skyflatnum);
        bVar8 = false;
        if (bVar1) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_114,
                     SUB84(oldfloorz_local,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_114);
          bVar8 = uVar3 == 0;
        }
        if (!bVar8) {
          P_ExplodeMissile((AActor *)oldfloorz_local,(line_t_conflict *)0x0,(AActor *)0x0);
          return;
        }
        (**(code **)(*(long *)oldfloorz_local + 0x20))();
        return;
      }
    }
  }
  P_CheckFakeFloorTriggers((AActor *)oldfloorz_local,grav,false);
  return;
}

Assistant:

void P_ZMovement (AActor *mo, double oldfloorz)
{
	double dist;
	double delta;
	double oldz = mo->Z();
	double grav = mo->GetGravity();

//
// check for smooth step up
//
	if (mo->player && mo->player->mo == mo && mo->Z() < mo->floorz)
	{
		mo->player->viewheight -= mo->floorz - mo->Z();
		mo->player->deltaviewheight = mo->player->GetDeltaViewHeight();
	}

	mo->AddZ(mo->Vel.Z);

//
// apply gravity
//
	if (mo->Z() > mo->floorz && !(mo->flags & MF_NOGRAVITY))
	{
		double startvelz = mo->Vel.Z;

		if (mo->waterlevel == 0 || (mo->player &&
			!(mo->player->cmd.ucmd.forwardmove | mo->player->cmd.ucmd.sidemove)))
		{
			// [RH] Double gravity only if running off a ledge. Coming down from
			// an upward thrust (e.g. a jump) should not double it.
			if (mo->Vel.Z == 0 && oldfloorz > mo->floorz && mo->Z() == oldfloorz)
			{
				mo->Vel.Z -= grav + grav;
			}
			else
			{
				mo->Vel.Z -= grav;
			}
		}
		if (mo->player == NULL)
		{
			if (mo->waterlevel >= 1)
			{
				double sinkspeed;

				if ((mo->flags & MF_SPECIAL) && !(mo->flags3 & MF3_ISMONSTER))
				{ // Pickup items don't sink if placed and drop slowly if dropped
					sinkspeed = (mo->flags & MF_DROPPED) ? -WATER_SINK_SPEED / 8 : 0;
				}
				else
				{
					sinkspeed = -WATER_SINK_SPEED;

					// If it's not a player, scale sinkspeed by its mass, with
					// 100 being equivalent to a player.
					if (mo->player == NULL)
					{
						sinkspeed = sinkspeed * clamp(mo->Mass, 1, 4000) / 100;
					}
				}
				if (mo->Vel.Z < sinkspeed)
				{ // Dropping too fast, so slow down toward sinkspeed.
					mo->Vel.Z -= MAX(sinkspeed*2, -8.);
					if (mo->Vel.Z > sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
				else if (mo->Vel.Z > sinkspeed)
				{ // Dropping too slow/going up, so trend toward sinkspeed.
					mo->Vel.Z = startvelz + MAX(sinkspeed/3, -8.);
					if (mo->Vel.Z < sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
			}
		}
		else
		{
			if (mo->waterlevel > 1)
			{
				double sinkspeed = -WATER_SINK_SPEED;

				if (mo->Vel.Z < sinkspeed)
				{
					mo->Vel.Z = (startvelz < sinkspeed) ? startvelz : sinkspeed;
				}
				else
				{
					mo->Vel.Z = startvelz + ((mo->Vel.Z - startvelz) *
						(mo->waterlevel == 1 ? WATER_SINK_SMALL_FACTOR : WATER_SINK_FACTOR));
				}
			}
		}
	}

	// Hexen compatibility handling for floatbobbing. Ugh...
	// Hexen yanked all items to the floor, except those being spawned at map start in the air.
	// Those were kept at their original height.
	// Do this only if the item was actually spawned by the map above ground to avoid problems.
	if (mo->specialf1 > 0 && (mo->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
	{
		mo->SetZ(mo->floorz + mo->specialf1);
	}


//
// adjust height
//
	if ((mo->flags & MF_FLOAT) && !(mo->flags2 & MF2_DORMANT) && mo->target)
	{	// float down towards target if too close
		if (!(mo->flags & (MF_SKULLFLY | MF_INFLOAT)))
		{
			dist = mo->Distance2D (mo->target);
			delta = (mo->target->Center()) - mo->Z();
			if (delta < 0 && dist < -(delta*3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta*3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && (mo->flags & MF_NOGRAVITY) && (mo->Z() > mo->floorz))
	{
		if (!mo->IsNoClip2())
		{
			mo->AddZ(DAngle(360 / 80.f * level.maptime).Sin() / 8);
		}
		mo->Vel.Z *= FRICTION_FLY;
	}
	if (mo->waterlevel && !(mo->flags & MF_NOGRAVITY))
	{
		double friction = -1;

		// Check 3D floors -- might be the source of the waterlevel
		for (auto rover : mo->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() >= rover->top.plane->ZatPoint(mo) ||
				mo->Center() < rover->bottom.plane->ZatPoint(mo))
				continue;

			friction = rover->model->GetFriction(rover->top.isceiling);
			break;
		}
		if (friction < 0)
			friction = mo->Sector->GetFriction();	// get real friction, even if from a terrain definition

		mo->Vel.Z *= friction;
	}

//
// clip movement
//
	if (mo->Z() <= mo->floorz)
	{	// Hit the floor
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->floorplane.ZatPoint(mo) == mo->floorz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
		}
		P_CheckFor3DFloorHit(mo, mo->floorz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer below the floor.
		if (mo->Z() <= mo->floorz)
		{
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				mo->SetZ(mo->floorz);
				if (mo->BounceFlags & BOUNCE_Floors)
				{
					mo->FloorBounceMissile (mo->floorsector->floorplane);
					/* if (!(mo->flags6 & MF6_CANJUMP)) */ return;
				}
				else if (mo->flags3 & MF3_NOEXPLODEFLOOR)
				{
					P_HitFloor (mo);
					mo->Vel.Z = 0;
					return;
				}
				else if (mo->flags3 & MF3_FLOORHUGGER)
				{ // Floor huggers can go up steps
					return;
				}
				else
				{
					if (mo->floorpic == skyflatnum && !(mo->flags3 & MF3_SKYEXPLODE))
					{
						// [RH] Just remove the missile without exploding it
						//		if this is a sky floor.
						mo->Destroy ();
						return;
					}
					P_HitFloor (mo);
					P_ExplodeMissile (mo, NULL, NULL);
					return;
				}
			}
			else if (mo->BounceFlags & BOUNCE_MBF && mo->Vel.Z) // check for MBF-like bounce on non-missiles
			{
				mo->FloorBounceMissile(mo->floorsector->floorplane);
			}
			if (mo->flags3 & MF3_ISMONSTER)		// Blasted mobj falling
			{
				if (mo->Vel.Z < -23)
				{
					P_MonsterFallingDamage (mo);
				}
			}
			mo->SetZ(mo->floorz);
			if (mo->Vel.Z < 0)
			{
				const double minvel = -8;	// landing speed from a jump with normal gravity

				// Spawn splashes, etc.
				P_HitFloor (mo);
				if (mo->DamageType == NAME_Ice && mo->Vel.Z < minvel)
				{
					mo->tics = 1;
					mo->Vel.Zero();
					return;
				}
				// Let the actor do something special for hitting the floor
				if (mo->flags7 & MF7_SMASHABLE)
				{
					P_DamageMobj(mo, nullptr, nullptr, mo->health, NAME_Smash);
				}
				if (mo->player)
				{
					if (mo->player->jumpTics < 0 || mo->Vel.Z < minvel)
					{ // delay any jumping for a short while
						mo->player->jumpTics = 7;
					}
					if (mo->Vel.Z < minvel && !(mo->flags & MF_NOGRAVITY))
					{
						// Squat down.
						// Decrease viewheight for a moment after hitting the ground (hard),
						// and utter appropriate sound.
						PlayerLandedOnThing (mo, NULL);
					}
				}
				mo->Vel.Z = 0;
			}
			if (mo->flags & MF_SKULLFLY)
			{ // The skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			mo->Crash();
		}
	}

	if (mo->flags2 & MF2_FLOORCLIP)
	{
		mo->AdjustFloorClip ();
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->ceilingplane.ZatPoint(mo) == mo->ceilingz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitCeiling);
		}
		P_CheckFor3DCeilingHit(mo, mo->ceilingz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer above the ceiling.
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz - mo->Height);
			if (mo->BounceFlags & BOUNCE_Ceilings)
			{	// ceiling bounce
				mo->FloorBounceMissile (mo->ceilingsector->ceilingplane);
				/*if (!(mo->flags6 & MF6_CANJUMP))*/ return;
			}
			if (mo->flags & MF_SKULLFLY)
			{	// the skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			if (mo->Vel.Z > 0)
				mo->Vel.Z = 0;
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				if (mo->flags3 & MF3_CEILINGHUGGER)
				{
					return;
				}
				if (mo->ceilingpic == skyflatnum &&  !(mo->flags3 & MF3_SKYEXPLODE))
				{
					mo->Destroy ();
					return;
				}
				P_ExplodeMissile (mo, NULL, NULL);
				return;
			}
		}
	}
	P_CheckFakeFloorTriggers (mo, oldz);
}